

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ConfigSetValue(Fts5Config *pConfig,char *zKey,sqlite3_value *pVal,int *pbBadkey)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uchar *zIn;
  i64 iVar4;
  char *zRankArgs;
  char *zRank;
  
  iVar2 = sqlite3_stricmp(zKey,"pgsz");
  if (iVar2 == 0) {
    iVar2 = sqlite3_value_numeric_type(pVal);
    if (iVar2 == 1) {
      iVar4 = sqlite3VdbeIntValue(pVal);
      if (0xfffdffff < (int)iVar4 - 0x20001U) {
        pConfig->pgsz = (int)iVar4;
        return 0;
      }
    }
  }
  else {
    iVar2 = sqlite3_stricmp(zKey,"hashsize");
    if (iVar2 == 0) {
      iVar2 = sqlite3_value_numeric_type(pVal);
      if (iVar2 == 1) {
        iVar4 = sqlite3VdbeIntValue(pVal);
        if (0 < (int)iVar4) {
          pConfig->nHashSize = (int)iVar4;
          return 0;
        }
      }
    }
    else {
      iVar2 = sqlite3_stricmp(zKey,"automerge");
      if (iVar2 == 0) {
        iVar2 = sqlite3_value_numeric_type(pVal);
        if (iVar2 == 1) {
          iVar4 = sqlite3VdbeIntValue(pVal);
          uVar3 = (uint)iVar4;
          if (uVar3 < 0x41) {
            uVar1 = 4;
            if (uVar3 != 1) {
              uVar1 = uVar3;
            }
            pConfig->nAutomerge = uVar1;
            return 0;
          }
        }
      }
      else {
        iVar2 = sqlite3_stricmp(zKey,"usermerge");
        if (iVar2 == 0) {
          iVar2 = sqlite3_value_numeric_type(pVal);
          if (iVar2 == 1) {
            iVar4 = sqlite3VdbeIntValue(pVal);
            if (0xfffffff0 < (int)iVar4 - 0x11U) {
              pConfig->nUsermerge = (int)iVar4;
              return 0;
            }
          }
        }
        else {
          iVar2 = sqlite3_stricmp(zKey,"crisismerge");
          if (iVar2 == 0) {
            iVar2 = sqlite3_value_numeric_type(pVal);
            if (iVar2 == 1) {
              iVar4 = sqlite3VdbeIntValue(pVal);
              uVar3 = (uint)iVar4;
              if (-1 < (int)uVar3) {
                uVar1 = 0x10;
                if (1 < uVar3) {
                  uVar1 = uVar3;
                }
                pConfig->nCrisisMerge = uVar1;
                return 0;
              }
            }
          }
          else {
            iVar2 = sqlite3_stricmp(zKey,"rank");
            if (iVar2 == 0) {
              zIn = sqlite3_value_text(pVal);
              iVar2 = sqlite3Fts5ConfigParseRank((char *)zIn,&zRank,&zRankArgs);
              if (iVar2 != 1) {
                if (iVar2 == 0) {
                  sqlite3_free(pConfig->zRank);
                  sqlite3_free(pConfig->zRankArgs);
                  pConfig->zRank = zRank;
                  pConfig->zRankArgs = zRankArgs;
                  return 0;
                }
                return iVar2;
              }
            }
          }
        }
      }
    }
  }
  *pbBadkey = 1;
  return 0;
}

Assistant:

static int sqlite3Fts5ConfigSetValue(
  Fts5Config *pConfig, 
  const char *zKey, 
  sqlite3_value *pVal,
  int *pbBadkey
){
  int rc = SQLITE_OK;

  if( 0==sqlite3_stricmp(zKey, "pgsz") ){
    int pgsz = 0;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      pgsz = sqlite3_value_int(pVal);
    }
    if( pgsz<=0 || pgsz>FTS5_MAX_PAGE_SIZE ){
      *pbBadkey = 1;
    }else{
      pConfig->pgsz = pgsz;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "hashsize") ){
    int nHashSize = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nHashSize = sqlite3_value_int(pVal);
    }
    if( nHashSize<=0 ){
      *pbBadkey = 1;
    }else{
      pConfig->nHashSize = nHashSize;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "automerge") ){
    int nAutomerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nAutomerge = sqlite3_value_int(pVal);
    }
    if( nAutomerge<0 || nAutomerge>64 ){
      *pbBadkey = 1;
    }else{
      if( nAutomerge==1 ) nAutomerge = FTS5_DEFAULT_AUTOMERGE;
      pConfig->nAutomerge = nAutomerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "usermerge") ){
    int nUsermerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nUsermerge = sqlite3_value_int(pVal);
    }
    if( nUsermerge<2 || nUsermerge>16 ){
      *pbBadkey = 1;
    }else{
      pConfig->nUsermerge = nUsermerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "crisismerge") ){
    int nCrisisMerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nCrisisMerge = sqlite3_value_int(pVal);
    }
    if( nCrisisMerge<0 ){
      *pbBadkey = 1;
    }else{
      if( nCrisisMerge<=1 ) nCrisisMerge = FTS5_DEFAULT_CRISISMERGE;
      pConfig->nCrisisMerge = nCrisisMerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "rank") ){
    const char *zIn = (const char*)sqlite3_value_text(pVal);
    char *zRank;
    char *zRankArgs;
    rc = sqlite3Fts5ConfigParseRank(zIn, &zRank, &zRankArgs);
    if( rc==SQLITE_OK ){
      sqlite3_free(pConfig->zRank);
      sqlite3_free(pConfig->zRankArgs);
      pConfig->zRank = zRank;
      pConfig->zRankArgs = zRankArgs;
    }else if( rc==SQLITE_ERROR ){
      rc = SQLITE_OK;
      *pbBadkey = 1;
    }
  }else{
    *pbBadkey = 1;
  }
  return rc;
}